

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_lpf1_clear_cache(ma_lpf1 *pLPF)

{
  if (pLPF != (ma_lpf1 *)0x0) {
    (pLPF->a).f32 = 0.0;
    return MA_SUCCESS;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_lpf1_clear_cache(ma_lpf1* pLPF)
{
    if (pLPF == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pLPF->format == ma_format_f32) {
        pLPF->a.f32 = 0;
    } else {
        pLPF->a.s32 = 0;
    }

    return MA_SUCCESS;
}